

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fastpfor.cpp
# Opt level: O2

void __thiscall
FastPForLib::FastPForTest_fastpack_5_except_Test::~FastPForTest_fastpack_5_except_Test
          (FastPForTest_fastpack_5_except_Test *this)

{
  FastPForTest::~FastPForTest(&this->super_FastPForTest);
  operator_delete(this,0x80);
  return;
}

Assistant:

TEST_P(FastPForTest, fastpack_5_except) {
    _genDataWithFixBits(in32, 5, 256);
    in32[10] = 10002124;
    in32[77] = 20002124;
    in32[177] = 50002124;
    _verify();
    _copy64();
    _verify64();
  }